

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void iadst8x8_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m128i *out0;
  byte bVar2;
  int iVar3;
  long lVar4;
  int32_t (*out1) [64];
  undefined1 auVar5 [16];
  __m128i alVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar20;
  int iVar21;
  undefined1 auVar19 [16];
  int iVar22;
  undefined1 auVar23 [16];
  __m128i alVar24;
  undefined1 auVar25 [16];
  int shift;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  out0 = (__m128i *)(ulong)(uint)out_shift;
  lVar4 = (long)bit;
  auVar8 = ZEXT416((uint)bit);
  out1 = av1_cospi_arr_data;
  iVar3 = LoadMaskz2[lVar4 * 8 + 4][4];
  auVar19._4_4_ = iVar3;
  auVar19._0_4_ = iVar3;
  auVar19._8_4_ = iVar3;
  auVar19._12_4_ = iVar3;
  uVar1 = *(undefined4 *)(&DAT_00431d30 + lVar4 * 0x100);
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  iVar3 = LoadMaskz2[lVar4 * 8 + 6][0];
  auVar17._4_4_ = iVar3;
  auVar17._0_4_ = iVar3;
  auVar17._8_4_ = iVar3;
  auVar17._12_4_ = iVar3;
  uVar1 = *(undefined4 *)(&DAT_00431d00 + lVar4 * 0x100);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_00431cc0 + lVar4 * 0x20);
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  auVar5 = pmulld(auVar5,(undefined1  [16])*in);
  alVar6[0]._0_4_ = auVar5._0_4_ + iVar3 >> auVar8;
  alVar6[0]._4_4_ = auVar5._4_4_ + iVar3 >> auVar8;
  alVar6[1]._0_4_ = auVar5._8_4_ + iVar3 >> auVar8;
  alVar6[1]._4_4_ = auVar5._12_4_ + iVar3 >> auVar8;
  auVar5 = pmulld(auVar19,(undefined1  [16])*in);
  auVar25._0_4_ = iVar3 - auVar5._0_4_ >> auVar8;
  auVar25._4_4_ = iVar3 - auVar5._4_4_ >> auVar8;
  auVar25._8_4_ = iVar3 - auVar5._8_4_ >> auVar8;
  auVar25._12_4_ = iVar3 - auVar5._12_4_ >> auVar8;
  auVar5 = pmulld((undefined1  [16])alVar6,auVar17);
  auVar19 = pmulld(auVar25,auVar23);
  auVar7._0_4_ = auVar5._0_4_ + iVar3 + auVar19._0_4_ >> auVar8;
  auVar7._4_4_ = auVar5._4_4_ + iVar3 + auVar19._4_4_ >> auVar8;
  auVar7._8_4_ = auVar5._8_4_ + iVar3 + auVar19._8_4_ >> auVar8;
  auVar7._12_4_ = auVar5._12_4_ + iVar3 + auVar19._12_4_ >> auVar8;
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar19 = pmulld(auVar23,(undefined1  [16])alVar6);
  auVar5 = pmulld(auVar17,auVar25);
  alVar24[0]._0_4_ = (auVar19._0_4_ + iVar3) - auVar5._0_4_ >> auVar8;
  alVar24[0]._4_4_ = (auVar19._4_4_ + iVar3) - auVar5._4_4_ >> auVar8;
  alVar24[1]._0_4_ = (auVar19._8_4_ + iVar3) - auVar5._8_4_ >> auVar8;
  alVar24[1]._4_4_ = (auVar19._12_4_ + iVar3) - auVar5._12_4_ >> auVar8;
  auVar19 = pmulld((undefined1  [16])alVar6,auVar16);
  auVar5 = pmulld(auVar25,auVar16);
  iVar18 = auVar19._0_4_ + iVar3;
  iVar20 = auVar19._4_4_ + iVar3;
  iVar21 = auVar19._8_4_ + iVar3;
  iVar22 = auVar19._12_4_ + iVar3;
  shift = iVar18 + auVar5._0_4_ >> auVar8;
  auVar19 = pmulld(auVar7,auVar16);
  auVar17 = pmulld(auVar16,(undefined1  [16])alVar24);
  iVar13 = auVar19._0_4_ + iVar3;
  iVar14 = auVar19._4_4_ + iVar3;
  iVar15 = auVar19._8_4_ + iVar3;
  iVar3 = auVar19._12_4_ + iVar3;
  iVar9 = iVar13 + auVar17._0_4_ >> auVar8;
  iVar10 = iVar14 + auVar17._4_4_ >> auVar8;
  iVar11 = iVar15 + auVar17._8_4_ >> auVar8;
  iVar12 = iVar3 + auVar17._12_4_ >> auVar8;
  if (do_cols == 0) {
    bVar2 = 10;
    if (10 < bd) {
      bVar2 = (byte)bd;
    }
    iVar3 = 0x20 << (bVar2 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar3;
    clamp_hi_out[0]._0_4_ = iVar3 + -1;
    in0[1] = (longlong)(out + 1);
    in0[0] = (longlong)out;
    in1[1] = (longlong)clamp_hi_out;
    in1[0] = (longlong)clamp_lo_out;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    neg_shift_sse4_1(in0,in1,out0,(__m128i *)av1_cospi_arr_data,(__m128i *)CONCAT44(iVar10,iVar9),
                     (__m128i *)CONCAT44(iVar12,iVar11),shift);
    in0_00[1] = (longlong)(out + 3);
    in0_00[0] = (longlong)(out + 2);
    in1_00[1] = (longlong)clamp_hi_out;
    in1_00[0] = (longlong)clamp_lo_out;
    neg_shift_sse4_1(in0_00,in1_00,out0,(__m128i *)out1,(__m128i *)CONCAT44(iVar10,iVar9),
                     (__m128i *)CONCAT44(iVar12,iVar11),shift);
    in0_01[1] = (longlong)(out + 5);
    in0_01[0] = (longlong)(out + 4);
    in1_01[1] = (longlong)clamp_hi_out;
    in1_01[0] = (longlong)clamp_lo_out;
    neg_shift_sse4_1(in0_01,in1_01,out0,(__m128i *)out1,(__m128i *)CONCAT44(iVar10,iVar9),
                     (__m128i *)CONCAT44(iVar12,iVar11),shift);
    in0_02[1] = (longlong)(out + 7);
    in0_02[0] = (longlong)(out + 6);
    in1_02[1] = (longlong)clamp_hi_out;
    in1_02[0] = (longlong)clamp_lo_out;
    neg_shift_sse4_1(in0_02,in1_02,out0,(__m128i *)out1,(__m128i *)CONCAT44(iVar10,iVar9),
                     (__m128i *)CONCAT44(iVar12,iVar11),shift);
  }
  else {
    *out = alVar6;
    *(int *)out[1] = -auVar7._0_4_;
    *(int *)((long)out[1] + 4) = -auVar7._4_4_;
    *(int *)(out[1] + 1) = -auVar7._8_4_;
    *(int *)((long)out[1] + 0xc) = -auVar7._12_4_;
    *(int *)out[2] = iVar9;
    *(int *)((long)out[2] + 4) = iVar10;
    *(int *)(out[2] + 1) = iVar11;
    *(int *)((long)out[2] + 0xc) = iVar12;
    *(int *)out[3] = -shift;
    *(int *)((long)out[3] + 4) = -(iVar20 + auVar5._4_4_ >> auVar8);
    *(int *)(out[3] + 1) = -(iVar21 + auVar5._8_4_ >> auVar8);
    *(int *)((long)out[3] + 0xc) = -(iVar22 + auVar5._12_4_ >> auVar8);
    *(int *)out[4] = iVar18 - auVar5._0_4_ >> auVar8;
    *(int *)((long)out[4] + 4) = iVar20 - auVar5._4_4_ >> auVar8;
    *(int *)(out[4] + 1) = iVar21 - auVar5._8_4_ >> auVar8;
    *(int *)((long)out[4] + 0xc) = iVar22 - auVar5._12_4_ >> auVar8;
    *(int *)out[5] = -(iVar13 - auVar17._0_4_ >> auVar8);
    *(int *)((long)out[5] + 4) = -(iVar14 - auVar17._4_4_ >> auVar8);
    *(int *)(out[5] + 1) = -(iVar15 - auVar17._8_4_ >> auVar8);
    *(int *)((long)out[5] + 0xc) = -(iVar3 - auVar17._12_4_ >> auVar8);
    out[6] = alVar24;
    *(int *)out[7] = -auVar25._0_4_;
    *(int *)((long)out[7] + 4) = -auVar25._4_4_;
    *(int *)(out[7] + 1) = -auVar25._8_4_;
    *(int *)((long)out[7] + 0xc) = -auVar25._12_4_;
  }
  return;
}

Assistant:

static void iadst8x8_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                 int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  __m128i u[8], x;

  // stage 0
  // stage 1
  // stage 2

  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(kZero, x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // stage 3
  // stage 4
  __m128i temp1, temp2;
  temp1 = _mm_mullo_epi32(u[0], cospi16);
  x = _mm_mullo_epi32(u[1], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);
  u[4] = temp1;

  temp2 = _mm_mullo_epi32(u[0], cospi48);
  x = _mm_mullo_epi32(u[1], cospi16);
  u[5] = _mm_sub_epi32(temp2, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // stage 5
  // stage 6
  temp1 = _mm_mullo_epi32(u[0], cospi32);
  x = _mm_mullo_epi32(u[1], cospi32);
  u[2] = _mm_add_epi32(temp1, x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(temp1, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  temp1 = _mm_mullo_epi32(u[4], cospi32);
  x = _mm_mullo_epi32(u[5], cospi32);
  u[6] = _mm_add_epi32(temp1, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(temp1, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
  }
}